

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O2

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  allocated_headers *paVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar4 = lws_hdr_total_length(wsi,h);
  *dst = '\0';
  uVar5 = 0;
  if (uVar4 != 0) {
    if (((int)uVar4 < len) && (paVar6 = (wsi->http).ah, paVar6 != (allocated_headers *)0x0)) {
      bVar1 = paVar6->frag_index[h];
      uVar8 = (ulong)bVar1;
      if (h == WSI_TOKEN_HTTP_URI_ARGS) {
        _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n","lws_hdr_copy",uVar8);
      }
      uVar5 = 0;
      if (bVar1 != 0) {
        do {
          while( true ) {
            paVar6 = (wsi->http).ah;
            uVar2 = paVar6->frags[uVar8].nfrag;
            if (h == WSI_TOKEN_HTTP_URI_ARGS) {
              _lws_log(4,"%s: WSI_TOKEN_HTTP_URI_ARGS \'%.*s\'\n","lws_hdr_copy",
                       (ulong)paVar6->frags[uVar8].len,paVar6->data + paVar6->frags[uVar8].offset);
              paVar6 = (wsi->http).ah;
            }
            uVar3 = paVar6->frags[uVar8].len;
            if (len <= (int)((uint)(uVar2 != '\0') + (uint)uVar3)) {
              _lws_log(4,"blowout len\n");
              return -1;
            }
            strncpy(dst,paVar6->data + paVar6->frags[uVar8].offset,(ulong)uVar3);
            paVar6 = (wsi->http).ah;
            uVar3 = paVar6->frags[uVar8].len;
            pcVar7 = dst + uVar3;
            len = len - (uint)uVar3;
            bVar1 = paVar6->frags[uVar8].nfrag;
            uVar8 = (ulong)bVar1;
            dst = pcVar7;
            if (uVar2 == '\0') break;
            if ((h == WSI_TOKEN_HTTP_SET_COOKIE) || (h == WSI_TOKEN_HTTP_COOKIE)) {
              *pcVar7 = ';';
              dst = pcVar7 + 1;
              break;
            }
            dst = pcVar7 + 1;
            if (h == WSI_TOKEN_HTTP_URI_ARGS) {
              *pcVar7 = '&';
              if (bVar1 == 0) {
                *dst = '\0';
                goto LAB_0012e3cf;
              }
            }
            else {
              *pcVar7 = ',';
              if (bVar1 == 0) {
                *dst = '\0';
                return uVar4;
              }
            }
          }
        } while (bVar1 != 0);
        *dst = '\0';
        if (h != WSI_TOKEN_HTTP_URI_ARGS) {
          return uVar4;
        }
LAB_0012e3cf:
        _lws_log(1,"%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n","lws_hdr_copy",(ulong)uVar4);
        uVar5 = uVar4;
      }
    }
    else {
      uVar5 = 0xffffffff;
    }
  }
  return uVar5;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS start frag %d\n", __func__, n);


	if (!n)
		return 0;
	do {
		comma = (wsi->http.ah->frags[n].nfrag) ? 1 : 0;

		if (h == WSI_TOKEN_HTTP_URI_ARGS)
			lwsl_notice("%s: WSI_TOKEN_HTTP_URI_ARGS '%.*s'\n", __func__, (int)wsi->http.ah->frags[n].len, &wsi->http.ah->data[wsi->http.ah->frags[n].offset]);

		if (wsi->http.ah->frags[n].len + comma >= len) {
			lwsl_notice("blowout len\n");
			return -1;
		}
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma) {
			if (h == WSI_TOKEN_HTTP_COOKIE || h == WSI_TOKEN_HTTP_SET_COOKIE)
				*dst++ = ';';
			else
				if (h == WSI_TOKEN_HTTP_URI_ARGS)
					*dst++ = '&';
				else
					*dst++ = ',';
		}
				
	} while (n);
	*dst = '\0';

	if (h == WSI_TOKEN_HTTP_URI_ARGS)
		lwsl_err("%s: WSI_TOKEN_HTTP_URI_ARGS toklen %d\n", __func__, (int)toklen);

	return toklen;
}